

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  string *str;
  int iVar1;
  TestPartResult *pTVar2;
  long *plVar3;
  ostream *poVar4;
  TestResult *this;
  undefined8 uVar5;
  size_type *psVar6;
  TimeInMillis ms;
  long lVar7;
  int iVar8;
  char *pcVar9;
  internal *this_00;
  int i;
  undefined1 local_e8 [8];
  string kTestcase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  undefined1 local_a0 [8];
  string detail;
  undefined1 local_78 [8];
  string summary;
  undefined1 local_50 [8];
  string location;
  
  local_e8 = (undefined1  [8])&kTestcase._M_string_length;
  summary.field_2._8_8_ = stream;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"testcase","");
  detail.field_2._8_8_ = test_info;
  if (test_info->is_in_another_shard_ != false) goto LAB_0011e0cf;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)summary.field_2._8_8_,"    <testcase",0xd);
  local_50 = (undefined1  [8])&location._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,*(char **)(detail.field_2._8_8_ + 0x20),(allocator<char> *)local_a0)
  ;
  OutputXmlAttribute((ostream *)summary.field_2._8_8_,(string *)local_e8,(string *)local_50,
                     (string *)local_78);
  psVar6 = &summary._M_string_length;
  if (local_78 != (undefined1  [8])psVar6) {
    operator_delete((void *)local_78,summary._M_string_length + 1);
  }
  if (local_50 != (undefined1  [8])&location._M_string_length) {
    operator_delete((void *)local_50,location._M_string_length + 1);
  }
  if ((*(long **)(detail.field_2._8_8_ + 0x48) != (long *)0x0) &&
     (**(long **)(detail.field_2._8_8_ + 0x48) != 0)) {
    local_50 = (undefined1  [8])&location._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"value_param","");
    if (*(undefined8 **)(detail.field_2._8_8_ + 0x48) == (undefined8 *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (char *)**(undefined8 **)(detail.field_2._8_8_ + 0x48);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,pcVar9,(allocator<char> *)local_a0);
    OutputXmlAttribute((ostream *)summary.field_2._8_8_,(string *)local_e8,(string *)local_50,
                       (string *)local_78);
    if (local_78 != (undefined1  [8])psVar6) {
      operator_delete((void *)local_78,summary._M_string_length + 1);
    }
    if (local_50 != (undefined1  [8])&location._M_string_length) {
      operator_delete((void *)local_50,location._M_string_length + 1);
    }
  }
  if ((*(long **)(detail.field_2._8_8_ + 0x40) != (long *)0x0) &&
     (**(long **)(detail.field_2._8_8_ + 0x40) != 0)) {
    local_50 = (undefined1  [8])&location._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"type_param","");
    if (*(undefined8 **)(detail.field_2._8_8_ + 0x40) == (undefined8 *)0x0) {
      pcVar9 = (char *)0x0;
    }
    else {
      pcVar9 = (char *)**(undefined8 **)(detail.field_2._8_8_ + 0x40);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_78,pcVar9,(allocator<char> *)local_a0);
    OutputXmlAttribute((ostream *)summary.field_2._8_8_,(string *)local_e8,(string *)local_50,
                       (string *)local_78);
    if (local_78 != (undefined1  [8])psVar6) {
      operator_delete((void *)local_78,summary._M_string_length + 1);
    }
    if (local_50 != (undefined1  [8])&location._M_string_length) {
      operator_delete((void *)local_50,location._M_string_length + 1);
    }
  }
  local_50 = (undefined1  [8])&location._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"status","");
  pcVar9 = "notrun";
  if ((ulong)*(byte *)(detail.field_2._8_8_ + 0x80) != 0) {
    pcVar9 = "run";
  }
  local_78 = (undefined1  [8])psVar6;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,pcVar9,
             pcVar9 + ((ulong)*(byte *)(detail.field_2._8_8_ + 0x80) ^ 1) * 3 + 3);
  OutputXmlAttribute((ostream *)summary.field_2._8_8_,(string *)local_e8,(string *)local_50,
                     (string *)local_78);
  if (local_78 != (undefined1  [8])psVar6) {
    operator_delete((void *)local_78,summary._M_string_length + 1);
  }
  if (local_50 != (undefined1  [8])&location._M_string_length) {
    operator_delete((void *)local_50,location._M_string_length + 1);
  }
  local_50 = (undefined1  [8])&location._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"time","");
  FormatTimeInMillisAsSeconds_abi_cxx11_
            ((string *)local_78,*(internal **)(detail.field_2._8_8_ + 0x100),ms);
  OutputXmlAttribute((ostream *)summary.field_2._8_8_,(string *)local_e8,(string *)local_50,
                     (string *)local_78);
  if (local_78 != (undefined1  [8])psVar6) {
    operator_delete((void *)local_78,summary._M_string_length + 1);
  }
  if (local_50 != (undefined1  [8])&location._M_string_length) {
    operator_delete((void *)local_50,location._M_string_length + 1);
  }
  local_50 = (undefined1  [8])&location._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"classname","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,test_case_name,(allocator<char> *)local_a0);
  OutputXmlAttribute((ostream *)summary.field_2._8_8_,(string *)local_e8,(string *)local_50,
                     (string *)local_78);
  if (local_78 != (undefined1  [8])psVar6) {
    operator_delete((void *)local_78,summary._M_string_length + 1);
  }
  if (local_50 != (undefined1  [8])&location._M_string_length) {
    operator_delete((void *)local_50,location._M_string_length + 1);
  }
  this = (TestResult *)(detail.field_2._8_8_ + 0x90);
  if ((int)((ulong)(*(long *)(detail.field_2._8_8_ + 0xd0) - *(long *)(detail.field_2._8_8_ + 200))
           >> 4) * -0x49249249 < 1) {
LAB_0011e06d:
    if ((int)((ulong)(*(long *)(detail.field_2._8_8_ + 0xe8) -
                     *(long *)(detail.field_2._8_8_ + 0xe0)) >> 6) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)summary.field_2._8_8_,">\n",2);
      goto LAB_0011e09c;
    }
    lVar7 = 4;
    pcVar9 = " />\n";
  }
  else {
    i = 0;
    str = (string *)(kTestcase.field_2._M_local_buf + 8);
    iVar8 = 0;
    uVar5 = this;
    do {
      iVar1 = (int)uVar5;
      pTVar2 = TestResult::GetTestPartResult(this,i);
      if (pTVar2->type_ != kSuccess) {
        if (iVar8 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)summary.field_2._8_8_,">\n",2);
        }
        this_00 = (internal *)(pTVar2->file_name_)._M_string_length;
        if (this_00 != (internal *)0x0) {
          this_00 = (internal *)(pTVar2->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  ((string *)local_50,this_00,(char *)(ulong)(uint)pTVar2->line_number_,iVar1);
        local_a0 = (undefined1  [8])&detail._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_a0,local_50,location._M_dataplus._M_p + (long)local_50);
        std::__cxx11::string::append((char *)local_a0);
        plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
        local_78 = (undefined1  [8])&summary._M_string_length;
        psVar6 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar6) {
          summary._M_string_length = *psVar6;
          summary.field_2._M_allocated_capacity = plVar3[3];
        }
        else {
          summary._M_string_length = *psVar6;
          local_78 = (undefined1  [8])*plVar3;
        }
        summary._M_dataplus._M_p = (pointer)plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_a0 != (undefined1  [8])&detail._M_string_length) {
          operator_delete((void *)local_a0,detail._M_string_length + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)summary.field_2._8_8_,"      <failure message=\"",0x18);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)str,(char *)local_78,
                   (allocator<char> *)(__str_1.field_2._M_local_buf + 0xf));
        EscapeXml((string *)local_a0,str,true);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)summary.field_2._8_8_,(char *)local_a0,
                            (long)detail._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" type=\"\">",10);
        if (local_a0 != (undefined1  [8])&detail._M_string_length) {
          operator_delete((void *)local_a0,detail._M_string_length + 1);
        }
        if ((size_type *)kTestcase.field_2._8_8_ != &__str_1._M_string_length) {
          operator_delete((void *)kTestcase.field_2._8_8_,__str_1._M_string_length + 1);
        }
        kTestcase.field_2._8_8_ = &__str_1._M_string_length;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)str,local_50,location._M_dataplus._M_p + (long)local_50);
        std::__cxx11::string::append((char *)str);
        plVar3 = (long *)std::__cxx11::string::append((char *)str);
        local_a0 = (undefined1  [8])&detail._M_string_length;
        psVar6 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar6) {
          detail._M_string_length = *psVar6;
          detail.field_2._M_allocated_capacity = plVar3[3];
        }
        else {
          detail._M_string_length = *psVar6;
          local_a0 = (undefined1  [8])*plVar3;
        }
        detail._M_dataplus._M_p = (pointer)plVar3[1];
        *plVar3 = (long)psVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if ((size_type *)kTestcase.field_2._8_8_ != &__str_1._M_string_length) {
          operator_delete((void *)kTestcase.field_2._8_8_,__str_1._M_string_length + 1);
        }
        RemoveInvalidXmlCharacters(str,(string *)local_a0);
        OutputXmlCDataSection((ostream *)summary.field_2._8_8_,(char *)kTestcase.field_2._8_8_);
        if ((size_type *)kTestcase.field_2._8_8_ != &__str_1._M_string_length) {
          operator_delete((void *)kTestcase.field_2._8_8_,__str_1._M_string_length + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)summary.field_2._8_8_,"</failure>\n",0xb);
        if (local_a0 != (undefined1  [8])&detail._M_string_length) {
          operator_delete((void *)local_a0,detail._M_string_length + 1);
        }
        if (local_78 != (undefined1  [8])&summary._M_string_length) {
          operator_delete((void *)local_78,summary._M_string_length + 1);
        }
        if (local_50 != (undefined1  [8])&location._M_string_length) {
          operator_delete((void *)local_50,location._M_string_length + 1);
        }
        iVar8 = iVar8 + 1;
      }
      i = i + 1;
      iVar1 = (int)((ulong)(*(long *)(detail.field_2._8_8_ + 0xd0) -
                           *(long *)(detail.field_2._8_8_ + 200)) >> 4);
      uVar5 = detail.field_2._8_8_;
    } while (SBORROW4(i,iVar1 * -0x49249249) != i + iVar1 * 0x49249249 < 0);
    if (iVar8 == 0) goto LAB_0011e06d;
LAB_0011e09c:
    OutputXmlTestProperties((ostream *)summary.field_2._8_8_,this);
    lVar7 = 0x10;
    pcVar9 = "    </testcase>\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)summary.field_2._8_8_,pcVar9,lVar7);
LAB_0011e0cf:
  if (local_e8 != (undefined1  [8])&kTestcase._M_string_length) {
    operator_delete((void *)local_e8,kTestcase._M_string_length + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}